

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall spv::Builder::smearScalar(Builder *this,Decoration precision,Id scalar,Id vectorType)

{
  bool bVar1;
  uint uVar2;
  Id IVar3;
  Id IVar4;
  Instruction *this_00;
  bool local_81;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_68;
  int local_5c;
  Op local_58;
  int c;
  Op opcode;
  bool replicate;
  Id result_id;
  vector<unsigned_int,_std::allocator<unsigned_int>_> members;
  Instruction *smear;
  int numComponents;
  Id vectorType_local;
  Id scalar_local;
  Decoration precision_local;
  Builder *this_local;
  
  numComponents = scalar;
  vectorType_local = precision;
  _scalar_local = this;
  uVar2 = getNumComponents(this,scalar);
  if (uVar2 != 1) {
    __assert_fail("getNumComponents(scalar) == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                  ,0xbed,"Id spv::Builder::smearScalar(Decoration, Id, Id)");
  }
  IVar3 = getTypeId(this,numComponents);
  IVar4 = getScalarTypeId(this,vectorType);
  if (IVar3 != IVar4) {
    __assert_fail("getTypeId(scalar) == getScalarTypeId(vectorType)",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                  ,0xbee,"Id spv::Builder::smearScalar(Decoration, Id, Id)");
  }
  smear._0_4_ = getNumTypeComponents(this,vectorType);
  if (((uint)smear == 1) && (bVar1 = isCooperativeVectorType(this,vectorType), !bVar1)) {
    return numComponents;
  }
  members.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((this->generatingOpCodeForSpecConst & 1U) != 0) {
    std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)&replicate);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&result_id,
               (long)(int)(uint)smear,(value_type_conflict *)&numComponents,
               (allocator_type *)&replicate);
    std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)&replicate);
    bVar1 = isSpecConstant(this,numComponents);
    opcode = makeCompositeConstant
                       (this,vectorType,
                        (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&result_id,bVar1);
    members.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)Module::getInstruction(&this->module,opcode);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&result_id);
    goto LAB_006dcd50;
  }
  if ((this->useReplicatedComposites & 1U) == 0) {
    bVar1 = isCooperativeVectorType(this,vectorType);
    local_81 = false;
    if (bVar1) goto LAB_006dcc6e;
  }
  else {
LAB_006dcc6e:
    local_81 = 0 < (int)(uint)smear;
  }
  c._3_1_ = local_81;
  if (local_81 != false) {
    smear._0_4_ = 1;
    addCapability(this,CapabilityReplicatedCompositesEXT);
    addExtension(this,"SPV_EXT_replicated_composites");
  }
  local_58 = OpCompositeConstruct;
  if ((c._3_1_ & 1) != 0) {
    local_58 = OpCompositeConstructReplicateEXT;
  }
  this_00 = (Instruction *)::operator_new(0x60);
  IVar3 = getUniqueId(this);
  spv::Instruction::Instruction(this_00,IVar3,vectorType,local_58);
  members.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this_00;
  spv::Instruction::reserveOperands(this_00,(long)(int)(uint)smear);
  for (local_5c = 0; local_5c < (int)(uint)smear; local_5c = local_5c + 1) {
    spv::Instruction::addIdOperand
              ((Instruction *)
               members.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage,numComponents);
  }
  std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
  unique_ptr<std::default_delete<spv::Instruction>,void>
            ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)&local_68,
             (pointer)members.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  addInstruction(this,&local_68);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(&local_68);
LAB_006dcd50:
  IVar3 = spv::Instruction::getResultId
                    ((Instruction *)
                     members.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                     .super__Vector_impl_data._M_end_of_storage);
  IVar3 = setPrecision(this,IVar3,vectorType_local);
  return IVar3;
}

Assistant:

Id Builder::smearScalar(Decoration precision, Id scalar, Id vectorType)
{
    assert(getNumComponents(scalar) == 1);
    assert(getTypeId(scalar) == getScalarTypeId(vectorType));

    int numComponents = getNumTypeComponents(vectorType);
    if (numComponents == 1 && !isCooperativeVectorType(vectorType))
        return scalar;

    Instruction* smear = nullptr;
    if (generatingOpCodeForSpecConst) {
        auto members = std::vector<spv::Id>(numComponents, scalar);
        // Sometime even in spec-constant-op mode, the temporary vector created by
        // promoting a scalar might not be a spec constant. This should depend on
        // the scalar.
        // e.g.:
        //  const vec2 spec_const_result = a_spec_const_vec2 + a_front_end_const_scalar;
        // In such cases, the temporary vector created from a_front_end_const_scalar
        // is not a spec constant vector, even though the binary operation node is marked
        // as 'specConstant' and we are in spec-constant-op mode.
        auto result_id = makeCompositeConstant(vectorType, members, isSpecConstant(scalar));
        smear = module.getInstruction(result_id);
    } else {
        bool replicate = (useReplicatedComposites || isCooperativeVectorType(vectorType)) && (numComponents > 0);

        if (replicate) {
            numComponents = 1;
            addCapability(spv::CapabilityReplicatedCompositesEXT);
            addExtension(spv::E_SPV_EXT_replicated_composites);
        }

        Op opcode = replicate ? OpCompositeConstructReplicateEXT : OpCompositeConstruct;

        smear = new Instruction(getUniqueId(), vectorType, opcode);
        smear->reserveOperands(numComponents);
        for (int c = 0; c < numComponents; ++c)
            smear->addIdOperand(scalar);
        addInstruction(std::unique_ptr<Instruction>(smear));
    }

    return setPrecision(smear->getResultId(), precision);
}